

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_hash_abort(psa_hash_operation_t *operation)

{
  psa_status_t pVar1;
  
  pVar1 = -0x89;
  switch(operation->alg) {
  case 0x1000003:
    mbedtls_md5_free(&(operation->ctx).md5);
    break;
  case 0x1000004:
    mbedtls_ripemd160_free(&(operation->ctx).ripemd160);
    break;
  case 0x1000005:
    mbedtls_sha1_free(&(operation->ctx).sha1);
    break;
  case 0x1000006:
  case 0x1000007:
    goto switchD_00111b20_caseD_1000006;
  case 0x1000008:
  case 0x1000009:
    mbedtls_sha256_free(&(operation->ctx).sha256);
    break;
  case 0x100000a:
  case 0x100000b:
    mbedtls_sha512_free(&(operation->ctx).sha512);
    break;
  default:
    if (operation->alg != 0) {
      return -0x89;
    }
  }
  operation->alg = 0;
  pVar1 = 0;
switchD_00111b20_caseD_1000006:
  return pVar1;
}

Assistant:

psa_status_t psa_hash_abort( psa_hash_operation_t *operation )
{
    switch( operation->alg )
    {
        case 0:
            /* The object has (apparently) been initialized but it is not
             * in use. It's ok to call abort on such an object, and there's
             * nothing to do. */
            break;
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            mbedtls_md2_free( &operation->ctx.md2 );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            mbedtls_md4_free( &operation->ctx.md4 );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            mbedtls_md5_free( &operation->ctx.md5 );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            mbedtls_ripemd160_free( &operation->ctx.ripemd160 );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            mbedtls_sha1_free( &operation->ctx.sha1 );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
        case PSA_ALG_SHA_256:
            mbedtls_sha256_free( &operation->ctx.sha256 );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
#endif
        case PSA_ALG_SHA_512:
            mbedtls_sha512_free( &operation->ctx.sha512 );
            break;
#endif
        default:
            return( PSA_ERROR_BAD_STATE );
    }
    operation->alg = 0;
    return( PSA_SUCCESS );
}